

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
          (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *this)

{
  Data *pDVar1;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar2;
  qsizetype capacity;
  long lVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> local_48;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->d).size;
  if (lVar3 != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
      if (pDVar1 == (Data *)0x0) {
        capacity = 0;
      }
      else {
        capacity = (pDVar1->super_QArrayData).alloc;
      }
      local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      ppVar2 = (pair<QPersistentModelIndex,_unsigned_int> *)
               QArrayData::allocate(&local_28,0x10,0x10,capacity,KeepSize);
      local_48.d = (this->d).d;
      local_48.ptr = (this->d).ptr;
      (this->d).d = (Data *)local_28;
      (this->d).ptr = ppVar2;
      local_48.size = (this->d).size;
      (this->d).size = 0;
      QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
                (&local_48);
    }
    else {
      ppVar2 = (this->d).ptr;
      lVar3 = lVar3 << 4;
      do {
        QPersistentModelIndex::~QPersistentModelIndex(&ppVar2->first);
        ppVar2 = ppVar2 + 1;
        lVar3 = lVar3 + -0x10;
      } while (lVar3 != 0);
      (this->d).size = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }